

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

char * ptls_hexdump(char *buf,void *_src,size_t len)

{
  uint8_t *puVar1;
  size_t local_38;
  size_t i;
  uint8_t *src;
  char *dst;
  size_t len_local;
  void *_src_local;
  char *buf_local;
  
  src = (uint8_t *)buf;
  for (local_38 = 0; local_38 != len; local_38 = local_38 + 1) {
    puVar1 = src + 1;
    *src = "0123456789abcdef0123456789abcdef0123456789abcdef"
           [(long)((int)(uint)*(byte *)((long)_src + local_38) >> 4) + 0x20];
    src = src + 2;
    *puVar1 = "0123456789abcdef0123456789abcdef0123456789abcdef"
              [(long)(int)(*(byte *)((long)_src + local_38) & 0xf) + 0x20];
  }
  *src = '\0';
  return buf;
}

Assistant:

char *ptls_hexdump(char *buf, const void *_src, size_t len)
{
    char *dst = buf;
    const uint8_t *src = _src;
    size_t i;

    for (i = 0; i != len; ++i) {
        *dst++ = "0123456789abcdef"[src[i] >> 4];
        *dst++ = "0123456789abcdef"[src[i] & 0xf];
    }
    *dst++ = '\0';
    return buf;
}